

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits.cpp
# Opt level: O1

ThresholdState __thiscall
AbstractThresholdConditionChecker::GetStateFor
          (AbstractThresholdConditionChecker *this,CBlockIndex *pindexPrev,Params *params,
          ThresholdConditionCache *cache)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  key_type pCVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t iVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  _Rb_tree_header *p_Var13;
  ThresholdState TVar14;
  CBlockIndex **ppCVar15;
  int iVar16;
  int iVar17;
  long in_FS_OFFSET;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> vToCompute;
  CBlockIndex **local_58;
  iterator iStack_50;
  CBlockIndex **local_48;
  CBlockIndex *local_40;
  long local_38;
  long lVar9;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = pindexPrev;
  iVar4 = (*this->_vptr_AbstractThresholdConditionChecker[4])(this,params);
  iVar5 = (*this->_vptr_AbstractThresholdConditionChecker[5])(this,params);
  iVar6 = (*this->_vptr_AbstractThresholdConditionChecker[3])(this,params);
  iVar7 = (*this->_vptr_AbstractThresholdConditionChecker[1])(this,params);
  lVar9 = CONCAT44(extraout_var,iVar7);
  iVar7 = (*this->_vptr_AbstractThresholdConditionChecker[2])(this,params);
  if (lVar9 == -1) {
    TVar14 = ACTIVE;
  }
  else if (lVar9 == -2) {
    TVar14 = FAILED;
  }
  else {
    if (local_40 != (CBlockIndex *)0x0) {
      local_40 = CBlockIndex::GetAncestor
                           (local_40,local_40->nHeight - (local_40->nHeight + 1) % iVar4);
    }
    local_58 = (CBlockIndex **)0x0;
    iStack_50._M_current = (CBlockIndex **)0x0;
    local_48 = (CBlockIndex **)0x0;
    p_Var1 = &(cache->_M_t)._M_impl.super__Rb_tree_header;
    while( true ) {
      p_Var2 = (cache->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var12 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
          p_Var2 = (&p_Var2->_M_left)[*(CBlockIndex **)(p_Var2 + 1) < local_40]) {
        if (*(CBlockIndex **)(p_Var2 + 1) >= local_40) {
          p_Var12 = p_Var2;
        }
      }
      p_Var13 = p_Var1;
      if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
         (p_Var13 = (_Rb_tree_header *)p_Var12,
         local_40 < (CBlockIndex *)((_Rb_tree_header *)p_Var12)->_M_node_count)) {
        p_Var13 = p_Var1;
      }
      if (p_Var13 != p_Var1) goto LAB_00b282fd;
      if ((local_40 == (CBlockIndex *)0x0) ||
         (iVar10 = CBlockIndex::GetMedianTimePast(local_40), iVar10 < lVar9)) break;
      if (iStack_50._M_current == local_48) {
        std::vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>>::
        _M_realloc_insert<CBlockIndex_const*const&>
                  ((vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>> *)&local_58,
                   iStack_50,&local_40);
      }
      else {
        *iStack_50._M_current = local_40;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      local_40 = CBlockIndex::GetAncestor(local_40,local_40->nHeight - iVar4);
    }
    pmVar11 = std::
              map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
              ::operator[](cache,&local_40);
    *pmVar11 = DEFINED;
LAB_00b282fd:
    p_Var2 = (cache->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var12 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[*(CBlockIndex **)(p_Var2 + 1) < local_40]) {
      if (*(CBlockIndex **)(p_Var2 + 1) >= local_40) {
        p_Var12 = p_Var2;
      }
    }
    p_Var13 = p_Var1;
    if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
       (p_Var13 = (_Rb_tree_header *)p_Var12,
       local_40 < (CBlockIndex *)((_Rb_tree_header *)p_Var12)->_M_node_count)) {
      p_Var13 = p_Var1;
    }
    if (p_Var13 == p_Var1) {
      __assert_fail("cache.count(pindexPrev)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/versionbits.cpp"
                    ,0x32,
                    "ThresholdState AbstractThresholdConditionChecker::GetStateFor(const CBlockIndex *, const Consensus::Params &, ThresholdConditionCache &) const"
                   );
    }
    pmVar11 = std::
              map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
              ::operator[](cache,&local_40);
    TVar14 = *pmVar11;
    if (local_58 != iStack_50._M_current) {
      do {
        local_40 = iStack_50._M_current[-1];
        iStack_50._M_current = iStack_50._M_current + -1;
        if (TVar14 == DEFINED) {
          iVar10 = CBlockIndex::GetMedianTimePast(local_40);
          TVar14 = (ThresholdState)(lVar9 <= iVar10);
        }
        else if (TVar14 == LOCKED_IN) {
          TVar14 = local_40->nHeight + 1 < iVar6 ^ ACTIVE;
        }
        else if (TVar14 == STARTED) {
          if (iVar4 < 1) {
            iVar16 = 0;
          }
          else {
            iVar16 = 0;
            ppCVar15 = &local_40;
            iVar17 = iVar4;
            do {
              pCVar3 = *ppCVar15;
              uVar8 = (**this->_vptr_AbstractThresholdConditionChecker)(this,pCVar3,params);
              iVar16 = iVar16 + (uVar8 & 0xff);
              ppCVar15 = &pCVar3->pprev;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
          TVar14 = LOCKED_IN;
          if (iVar16 < iVar5) {
            iVar10 = CBlockIndex::GetMedianTimePast(local_40);
            TVar14 = (uint)(CONCAT44(extraout_var_00,iVar7) <= iVar10) * 3 + STARTED;
          }
        }
        pmVar11 = std::
                  map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                  ::operator[](cache,&local_40);
        *pmVar11 = TVar14;
      } while (local_58 != iStack_50._M_current);
    }
    if (local_58 != (CBlockIndex **)0x0) {
      operator_delete(local_58,(long)local_48 - (long)local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return TVar14;
  }
  __stack_chk_fail();
}

Assistant:

ThresholdState AbstractThresholdConditionChecker::GetStateFor(const CBlockIndex* pindexPrev, const Consensus::Params& params, ThresholdConditionCache& cache) const
{
    int nPeriod = Period(params);
    int nThreshold = Threshold(params);
    int min_activation_height = MinActivationHeight(params);
    int64_t nTimeStart = BeginTime(params);
    int64_t nTimeTimeout = EndTime(params);

    // Check if this deployment is always active.
    if (nTimeStart == Consensus::BIP9Deployment::ALWAYS_ACTIVE) {
        return ThresholdState::ACTIVE;
    }

    // Check if this deployment is never active.
    if (nTimeStart == Consensus::BIP9Deployment::NEVER_ACTIVE) {
        return ThresholdState::FAILED;
    }

    // A block's state is always the same as that of the first of its period, so it is computed based on a pindexPrev whose height equals a multiple of nPeriod - 1.
    if (pindexPrev != nullptr) {
        pindexPrev = pindexPrev->GetAncestor(pindexPrev->nHeight - ((pindexPrev->nHeight + 1) % nPeriod));
    }

    // Walk backwards in steps of nPeriod to find a pindexPrev whose information is known
    std::vector<const CBlockIndex*> vToCompute;
    while (cache.count(pindexPrev) == 0) {
        if (pindexPrev == nullptr) {
            // The genesis block is by definition defined.
            cache[pindexPrev] = ThresholdState::DEFINED;
            break;
        }
        if (pindexPrev->GetMedianTimePast() < nTimeStart) {
            // Optimization: don't recompute down further, as we know every earlier block will be before the start time
            cache[pindexPrev] = ThresholdState::DEFINED;
            break;
        }
        vToCompute.push_back(pindexPrev);
        pindexPrev = pindexPrev->GetAncestor(pindexPrev->nHeight - nPeriod);
    }

    // At this point, cache[pindexPrev] is known
    assert(cache.count(pindexPrev));
    ThresholdState state = cache[pindexPrev];

    // Now walk forward and compute the state of descendants of pindexPrev
    while (!vToCompute.empty()) {
        ThresholdState stateNext = state;
        pindexPrev = vToCompute.back();
        vToCompute.pop_back();

        switch (state) {
            case ThresholdState::DEFINED: {
                if (pindexPrev->GetMedianTimePast() >= nTimeStart) {
                    stateNext = ThresholdState::STARTED;
                }
                break;
            }
            case ThresholdState::STARTED: {
                // We need to count
                const CBlockIndex* pindexCount = pindexPrev;
                int count = 0;
                for (int i = 0; i < nPeriod; i++) {
                    if (Condition(pindexCount, params)) {
                        count++;
                    }
                    pindexCount = pindexCount->pprev;
                }
                if (count >= nThreshold) {
                    stateNext = ThresholdState::LOCKED_IN;
                } else if (pindexPrev->GetMedianTimePast() >= nTimeTimeout) {
                    stateNext = ThresholdState::FAILED;
                }
                break;
            }
            case ThresholdState::LOCKED_IN: {
                // Progresses into ACTIVE provided activation height will have been reached.
                if (pindexPrev->nHeight + 1 >= min_activation_height) {
                    stateNext = ThresholdState::ACTIVE;
                }
                break;
            }
            case ThresholdState::FAILED:
            case ThresholdState::ACTIVE: {
                // Nothing happens, these are terminal states.
                break;
            }
        }
        cache[pindexPrev] = state = stateNext;
    }

    return state;
}